

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O0

DynamicObject * __thiscall
JsrtDebuggerObjectGlobalsNode::GetChildren
          (JsrtDebuggerObjectGlobalsNode *this,ScriptContext *scriptContext,uint fromCount,
          uint totalCount)

{
  int iVar1;
  IDiagObjectModelDisplay *pIVar2;
  undefined4 extraout_var;
  DynamicObject *childrens;
  IDiagObjectModelDisplay *objectDisplayRef;
  uint totalCount_local;
  uint fromCount_local;
  ScriptContext *scriptContext_local;
  JsrtDebuggerObjectGlobalsNode *this_local;
  
  pIVar2 = Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>::GetStrongReference
                     (this->objectDisplay);
  if (pIVar2 == (IDiagObjectModelDisplay *)0x0) {
    this_local = (JsrtDebuggerObjectGlobalsNode *)0x0;
  }
  else {
    if (this->walkerRef == (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)0x0) {
      iVar1 = (*pIVar2->_vptr_IDiagObjectModelDisplay[7])();
      this->walkerRef =
           (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)CONCAT44(extraout_var,iVar1);
    }
    this_local = (JsrtDebuggerObjectGlobalsNode *)
                 JsrtDebuggerObjectBase::GetChildren
                           (&this->super_JsrtDebuggerObjectBase,this->walkerRef,scriptContext,
                            fromCount,totalCount);
    Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>::ReleaseStrongReference
              (this->objectDisplay);
  }
  return (DynamicObject *)this_local;
}

Assistant:

Js::DynamicObject * JsrtDebuggerObjectGlobalsNode::GetChildren(Js::ScriptContext * scriptContext, uint fromCount, uint totalCount)
{
    Js::IDiagObjectModelDisplay* objectDisplayRef = objectDisplay->GetStrongReference();
    if (objectDisplayRef == nullptr)
    {
        return nullptr;
    }

    if (this->walkerRef == nullptr)
    {
        this->walkerRef = objectDisplayRef->CreateWalker();
    }

    Js::DynamicObject* childrens = __super::GetChildren(this->walkerRef, scriptContext, fromCount, totalCount);

    objectDisplay->ReleaseStrongReference();

    return childrens;
}